

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

LinearSpace3fa * __thiscall
embree::Geometry::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,Geometry *this,size_t primID,BBox1f time_range)

{
  undefined8 *puVar1;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"computeAlignedSpace not implemented for this geometry","");
  *puVar1 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar1 + 1) = 3;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_40,local_40 + local_38);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

virtual LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const {
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"computeAlignedSpace not implemented for this geometry"); 
    }